

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O0

history_t * HISTORY_create(void)

{
  history_t *h_00;
  history_t *h;
  
  h_00 = (history_t *)malloc(0x2008);
  HISTORY_reset(h_00);
  return h_00;
}

Assistant:

history_t *HISTORY_create()
{
    history_t *h = (history_t*)malloc(sizeof(history_t));
    HISTORY_reset(h);
    return h;
}